

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnImportFunc
          (BinaryReaderIR *this,Index import_index,string_view module_name,string_view field_name,
          Index func_index,Index sig_index)

{
  Module *this_00;
  pointer pFVar1;
  Location local_d8;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> local_b8;
  Location local_b0;
  Var local_90;
  undefined1 local_48 [8];
  __single_object import;
  Index import_index_local;
  BinaryReaderIR *this_local;
  string_view field_name_local;
  string_view module_name_local;
  
  field_name_local._M_len = (size_t)field_name._M_str;
  this_local = (BinaryReaderIR *)field_name._M_len;
  module_name_local._M_len = (size_t)module_name._M_str;
  field_name_local._M_str = (char *)module_name._M_len;
  import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
  super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_ = import_index;
  std::make_unique<wabt::FuncImport>();
  pFVar1 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pFVar1->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.module_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&field_name_local._M_str);
  pFVar1 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
                      local_48);
  std::__cxx11::string::operator=
            ((string *)&(pFVar1->super_ImportMixin<(wabt::ExternalKind)0>).super_Import.field_name,
             (basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  pFVar1 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::operator->
                     ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)
                      local_48);
  GetLocation(&local_b0,this);
  Var::Var(&local_90,sig_index,&local_b0);
  SetFuncDeclaration(this,&(pFVar1->func).decl,&local_90);
  Var::~Var(&local_90);
  this_00 = this->module_;
  GetLocation(&local_d8,this);
  std::
  make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
            (&local_b8,(Location *)local_48);
  Module::AppendField(this_00,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                               *)&local_b8);
  std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>::
  ~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> *)
              &local_b8);
  Result::Result((Result *)((long)&module_name_local._M_str + 4),Ok);
  std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::~unique_ptr
            ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)local_48);
  return (Result)module_name_local._M_str._4_4_;
}

Assistant:

Result BinaryReaderIR::OnImportFunc(Index import_index,
                                    std::string_view module_name,
                                    std::string_view field_name,
                                    Index func_index,
                                    Index sig_index) {
  auto import = std::make_unique<FuncImport>();
  import->module_name = module_name;
  import->field_name = field_name;
  SetFuncDeclaration(&import->func.decl, Var(sig_index, GetLocation()));
  module_->AppendField(
      std::make_unique<ImportModuleField>(std::move(import), GetLocation()));
  return Result::Ok;
}